

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O2

SymbolTable * __thiscall
hdc::SymbolTableBuilderVisitor::pushSymbolTable(SymbolTableBuilderVisitor *this)

{
  SymbolTable *parent;
  SymbolTable *this_00;
  
  parent = this->symbolTable;
  std::deque<hdc::SymbolTable_*,_std::allocator<hdc::SymbolTable_*>_>::push_back
            (&(this->symbolTableStack).c,&this->symbolTable);
  this_00 = (SymbolTable *)operator_new(0x48);
  SymbolTable::SymbolTable(this_00,parent);
  this->symbolTable = this_00;
  return this_00;
}

Assistant:

SymbolTable *SymbolTableBuilderVisitor::pushSymbolTable() {
    SymbolTable* old;

    old = symbolTable;
    symbolTableStack.push(symbolTable);
    symbolTable = new SymbolTable(old);

    return symbolTable;
}